

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

string_view __thiscall slang::ast::DefinitionSymbol::getKindString(DefinitionSymbol *this)

{
  char *pcVar1;
  string_view sVar2;
  size_t sStack_8;
  
  if (this->definitionKind == Module) {
    pcVar1 = "module";
    sStack_8 = 6;
  }
  else if (this->definitionKind == Program) {
    pcVar1 = "program";
    sStack_8 = 7;
  }
  else {
    pcVar1 = "interface";
    sStack_8 = 9;
  }
  sVar2._M_str = pcVar1;
  sVar2._M_len = sStack_8;
  return sVar2;
}

Assistant:

std::string_view DefinitionSymbol::getKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "module"sv;
        case DefinitionKind::Interface:
            return "interface"sv;
        case DefinitionKind::Program:
            return "program"sv;
    }
    SLANG_UNREACHABLE;
}